

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkNodeDup(Abc_Ntk_t *pNtkInit,int nLimit,int fVerbose)

{
  uint uVar1;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pFaninNew;
  Abc_Obj_t *pObj;
  uint uVar3;
  int iVar4;
  uint i;
  long lVar5;
  
  pNtkNew = Abc_NtkDup(pNtkInit);
  p = Vec_PtrAlloc(100);
  p_00 = Vec_PtrAlloc(100);
  do {
    p->nSize = 0;
    for (iVar4 = 0; iVar4 < pNtkNew->vObjs->nSize; iVar4 = iVar4 + 1) {
      pAVar2 = Abc_NtkObj(pNtkNew,iVar4);
      if (((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) &&
         (nLimit <= (pAVar2->vFanouts).nSize)) {
        Vec_PtrPush(p,pAVar2);
      }
    }
    uVar1 = p->nSize;
    i = 0;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    for (; i != uVar3; i = i + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p,i);
      pFaninNew = Abc_NtkDupObj(pNtkNew,pAVar2,0);
      for (lVar5 = 0; lVar5 < (pAVar2->vFanins).nSize; lVar5 = lVar5 + 1) {
        Abc_ObjAddFanin(pFaninNew,
                        (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar5]]);
      }
      Abc_NodeCollectFanouts(pAVar2,p_00);
      Vec_PtrShrink(p_00,nLimit / 2);
      for (iVar4 = 0; iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
        pObj = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar4);
        Abc_ObjPatchFanin(pObj,pAVar2,pFaninNew);
      }
    }
    if (fVerbose != 0) {
      printf("Duplicated %d nodes.\n",(ulong)uVar1);
    }
  } while (0 < (int)uVar1);
  Vec_PtrFree(p_00);
  Vec_PtrFree(p);
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkNodeDup( Abc_Ntk_t * pNtkInit, int nLimit, int fVerbose )
{
    Vec_Ptr_t * vNodes, * vFanouts;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj, * pObjNew, * pFanin, * pFanout;
    int i, k;
    pNtk = Abc_NtkDup( pNtkInit );
    vNodes = Vec_PtrAlloc( 100 );
    vFanouts = Vec_PtrAlloc( 100 );
    do
    {
        Vec_PtrClear( vNodes );
        Abc_NtkForEachNode( pNtk, pObj, i )
            if ( Abc_ObjFanoutNum(pObj) >= nLimit )
                Vec_PtrPush( vNodes, pObj );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        {
            pObjNew = Abc_NtkDupObj( pNtk, pObj, 0 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObjNew, pFanin );
            Abc_NodeCollectFanouts( pObj, vFanouts );
            Vec_PtrShrink( vFanouts, nLimit / 2 );
            Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, k )
                Abc_ObjPatchFanin( pFanout, pObj, pObjNew );
        }
        if ( fVerbose )
            printf( "Duplicated %d nodes.\n", Vec_PtrSize(vNodes) );
    }
    while ( Vec_PtrSize(vNodes) > 0 );
    Vec_PtrFree( vFanouts );
    Vec_PtrFree( vNodes );
    return pNtk;
}